

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testExportAsSinglePage(Test *this)

{
  bool bVar1;
  char cVar2;
  AutoTableElement *pAVar3;
  reference t1;
  double dVar4;
  QLatin1String latin1;
  QString filename;
  QTemporaryFile tempFile;
  Report report;
  QFont font;
  QSize size;
  QArrayDataPointer<QRect> local_58;
  QPixmap pix;
  QRect local_28;
  
  fillModel(this,1,0x28,false);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  pAVar3 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&filename,(QAbstractItemModel *)&this->m_model);
  KDReports::MainTable::setAutoTableElement(pAVar3);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&filename);
  KDReports::Report::scaleTo((int)&report,1);
  latin1.m_data = "Noto Sans";
  latin1.m_size = 9;
  QString::QString(&filename,latin1);
  QFont::QFont(&font,(QString *)&filename,-1,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&filename.d);
  QFont::setPointSize((int)&font);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QTemporaryFile::QTemporaryFile(&tempFile);
  bVar1 = (bool)(**(code **)(_tempFile + 0x68))(&tempFile,3);
  cVar2 = QTest::qVerify(bVar1,"tempFile.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                         ,0x21d);
  if (cVar2 != '\0') {
    QTemporaryFile::fileName();
    QFileDevice::close();
    size.wd = 1000;
    size.ht = 2000;
    bVar1 = (bool)KDReports::Report::exportToImage
                            ((QSize)&report,(QString *)0x7d0000003e8,(char *)&filename);
    cVar2 = QTest::qVerify(bVar1,"ok","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x222);
    if (cVar2 != '\0') {
      bVar1 = (bool)QFile::exists((QString *)&filename);
      cVar2 = QTest::qVerify(bVar1,"QFile::exists(filename)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x223);
      if (cVar2 != '\0') {
        QPixmap::QPixmap(&pix);
        bVar1 = (bool)QPixmap::load(&pix,&filename,0,0);
        cVar2 = QTest::qVerify(bVar1,"pix.load(filename)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x225);
        if (cVar2 != '\0') {
          local_58.d = (Data *)QPixmap::size();
          bVar1 = QTest::qCompare<QSize,QSize>
                            ((QSize *)&local_58,&size,"pix.size()","size",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x226);
          if (bVar1) {
            KDReports::Report::mainTable();
            KDReports::MainTable::pageRects();
            t1 = QList<QRect>::operator[]((QList<QRect> *)&local_58,0);
            local_28.x1 = 0;
            local_28.y1 = 0;
            local_28.x2 = 0;
            local_28.y2 = 0x27;
            bVar1 = QTest::qCompare<QRect,QRect>
                              (t1,&local_28,"report.mainTable()->pageRects()[0]",
                               "QRect(0, 0, 1, 40)",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x228);
            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_58);
            if (bVar1) {
              KDReports::Report::mainTable();
              dVar4 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
              cVar2 = QTest::qVerify(0.9999 < dVar4,
                                     "report.mainTable()->lastAutoFontScalingFactor() > 0.9999","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x229);
              if (cVar2 != '\0') {
                QFile::remove((QString *)&filename);
              }
            }
          }
        }
        QPixmap::~QPixmap(&pix);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&filename.d);
  }
  QTemporaryFile::~QTemporaryFile(&tempFile);
  QFont::~QFont(&font);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testExportAsSinglePage()
    {
        // Same testcase as testVerticalScaling, for now
        fillModel(1, 40);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(1, 2); // must cram 40 rows into 2 page vertically
        QFont font = QFont(QLatin1String(s_fontName));
        font.setPointSize(86); // huge :)
        report.setDefaultFont(font);
        // QCOMPARE(report.numberOfPages(), 2);

        // report.exportToFile( "testExportAsSinglePage.pdf" ); // for debugging

        QTemporaryFile tempFile;
        QVERIFY(tempFile.open());
        const QString filename = tempFile.fileName();
        tempFile.close();
        const QSize size(1000, 2000);
        bool ok = report.exportToImage(size, filename, "PNG");
        QVERIFY(ok);
        QVERIFY(QFile::exists(filename));
        QPixmap pix;
        QVERIFY(pix.load(filename));
        QCOMPARE(pix.size(), size);

        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 1, 40));
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() > 0.9999);
        // The only way to truly validate that it worked, though, is to open test-export.jpg and check...

        QFile::remove(filename);
    }